

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void RenderArrowsForVerticalBar
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,float bar_w,float alpha)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImU32 col;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  ImVec2 half_sz_00;
  undefined1 in_register_00001248 [56];
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  undefined1 in_register_000012c4 [12];
  
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = pos;
  auVar2._4_12_ = in_register_000012c4;
  auVar2._0_4_ = alpha;
  auVar2 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar2);
  auVar12._0_12_ = ZEXT812(0);
  auVar12._12_4_ = 0;
  auVar4._4_12_ = in_register_000012c4;
  auVar4._0_4_ = alpha;
  uVar3 = vcmpss_avx512f(auVar4,auVar12,1);
  auVar6._4_12_ = auVar2._4_12_;
  auVar6._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * auVar2._0_4_;
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x437f0000),0),auVar6,ZEXT416(0x3f000000));
  fVar1 = half_sz.x;
  fVar7 = pos.x + fVar1;
  half_sz_00.x = fVar1 + 2.0;
  half_sz_00.y = half_sz.y + 1.0;
  col = (int)auVar2._0_4_ * 0x1000000;
  auVar13 = auVar11._4_12_;
  auVar8._4_12_ = auVar13;
  auVar8._0_4_ = fVar7 + 1.0;
  ImGui::RenderArrowPointingAt(draw_list,auVar8._0_8_,half_sz_00,1,col);
  auVar5._4_4_ = pos.y + half_sz.y;
  auVar5._0_4_ = fVar7;
  auVar5._8_4_ = in_register_00001208._0_4_ + in_register_00001248._0_4_;
  auVar5._12_4_ = in_register_00001208._4_4_ + in_register_00001248._4_4_;
  auVar2 = vblendps_avx(auVar5,auVar11._0_16_,2);
  ImGui::RenderArrowPointingAt(draw_list,auVar2._0_8_,half_sz,1,col + 0xffffff);
  fVar1 = (pos.x + bar_w) - fVar1;
  auVar9._4_12_ = auVar13;
  auVar9._0_4_ = fVar1 + -1.0;
  ImGui::RenderArrowPointingAt(draw_list,auVar9._0_8_,half_sz_00,0,col);
  auVar10._4_12_ = auVar13;
  auVar10._0_4_ = fVar1;
  ImGui::RenderArrowPointingAt(draw_list,auVar10._0_8_,half_sz,0,col + 0xffffff);
  return;
}

Assistant:

static void RenderArrowsForVerticalBar(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, float bar_w, float alpha)
{
    ImU32 alpha8 = IM_F32_TO_INT8_SAT(alpha);
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x + 1,         pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Right, IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x,             pos.y), half_sz,                              ImGuiDir_Right, IM_COL32(255,255,255,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x - 1, pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Left,  IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x,     pos.y), half_sz,                              ImGuiDir_Left,  IM_COL32(255,255,255,alpha8));
}